

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

int __thiscall
CVmObjFrameDesc::getp_get_targprop
          (CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  if (getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar2 != 0) {
      getp_get_targprop::desc.min_argc_ = 0;
      getp_get_targprop::desc.opt_argc_ = 0;
      getp_get_targprop::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_targprop::desc);
  if (iVar2 == 0) {
    uVar1 = *(uint *)(this->super_CVmObject).ext_;
    CVmObjFrameRef::get_targprop
              ((CVmObjFrameRef *)(G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff)),retval);
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_targprop(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                       uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'targetprop' from the frame */
    get_frame_ref(vmg0_)->get_targprop(vmg_ retval);

    /* handled */
    return TRUE;
}